

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Matchers::Vector::ContainsMatcher<int,std::allocator<int>,std::allocator<int>>::match
          (ContainsMatcher<int,std::allocator<int>,std::allocator<int>> *this)

{
  vector<int,_std::allocator<int>_> *in_RSI;
  
  ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_>::match
            ((ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_> *)(this + -0x28),
             in_RSI);
  return;
}

Assistant:

bool match(std::vector<T, AllocMatch> const &v) const override {
                // !TBD: see note in EqualsMatcher
                if (m_comparator.size() > v.size())
                    return false;
                for (auto const& comparator : m_comparator) {
                    auto present = false;
                    for (const auto& el : v) {
                        if (el == comparator) {
                            present = true;
                            break;
                        }
                    }
                    if (!present) {
                        return false;
                    }
                }
                return true;
            }